

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall
t_py_generator::generate_process_function
          (t_py_generator *this,t_service *tservice,t_function *tfunction)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  t_struct *ptVar2;
  t_field *ptVar3;
  t_function *ptVar4;
  string *psVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  string *psVar9;
  char *pcVar10;
  pointer pptVar11;
  string argsname;
  string resultname;
  string local_2d0;
  t_py_generator *local_2b0;
  string local_2a8;
  string local_288;
  t_function *local_268;
  t_struct *local_260;
  string *local_258;
  string local_250;
  string local_230 [32];
  string local_210;
  string local_1f0 [32];
  string local_1d0;
  string local_1b0 [32];
  string local_190;
  string local_170;
  string local_150 [32];
  string local_130;
  string local_110 [32];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  os = &this->f_service_;
  local_268 = tfunction;
  if (this->gen_tornado_ == true) {
    t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_f0);
    poVar8 = std::operator<<(poVar8,"@gen.coroutine");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
    poVar8 = std::operator<<(poVar8,(string *)&local_50);
    poVar8 = std::operator<<(poVar8,"def process_");
    poVar8 = std::operator<<(poVar8,(string *)&local_268->name_);
    poVar8 = std::operator<<(poVar8,"(self, seqid, iprot, oprot):");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_f0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_f0);
    poVar8 = std::operator<<(poVar8,"def process_");
    poVar8 = std::operator<<(poVar8,(string *)&local_268->name_);
    poVar8 = std::operator<<(poVar8,"(self, seqid, iprot, oprot):");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_f0);
  ptVar4 = local_268;
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  psVar9 = &local_268->name_;
  std::operator+(&local_f0,psVar9,"_args");
  std::operator+(&local_50,psVar9,"_result");
  t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
  poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
  poVar8 = std::operator<<(poVar8,"args = ");
  poVar8 = std::operator<<(poVar8,(string *)&local_f0);
  poVar8 = std::operator<<(poVar8,"()");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
  poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
  poVar8 = std::operator<<(poVar8,"args.read(iprot)");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_288,&this->super_t_generator);
  poVar8 = std::operator<<(poVar8,(string *)&local_288);
  poVar8 = std::operator<<(poVar8,"iprot.readMessageEnd()");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2d0);
  local_260 = ptVar4->xceptions_;
  if (ptVar4->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    poVar8 = std::operator<<(poVar8,"result = ");
    poVar8 = std::operator<<(poVar8,(string *)&local_50);
    poVar8 = std::operator<<(poVar8,"()");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  local_2b0 = this;
  if (this->gen_twisted_ == true) {
    ptVar2 = ptVar4->arglist_;
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    poVar8 = std::operator<<(poVar8,"d = defer.maybeDeferred(self._handler.");
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    std::operator<<(poVar8,", ");
    std::__cxx11::string::~string((string *)&local_2d0);
    bVar6 = true;
    for (pptVar11 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar11 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
      if (!bVar6) {
        std::operator<<((ostream *)os,", ");
      }
      poVar8 = std::operator<<((ostream *)os,"args.");
      std::operator<<(poVar8,(string *)&(*pptVar11)->name_);
      bVar6 = false;
    }
    poVar8 = std::operator<<((ostream *)os,")");
    ptVar4 = local_268;
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    if (ptVar4->oneway_ == true) {
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"d.addErrback(self.handle_exception_");
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,", seqid)");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"d.addCallback(self.write_results_success_");
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,", result, seqid, oprot)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
      poVar8 = std::operator<<(poVar8,"d.addErrback(self.write_results_exception_");
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,", result, seqid, oprot)");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    std::__cxx11::string::~string((string *)&local_2d0);
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    poVar8 = std::operator<<(poVar8,"return d");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d0);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    if (ptVar4->oneway_ == true) {
      poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)os);
      poVar8 = std::operator<<(poVar8,"def handle_exception_");
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      pcVar10 = "(self, error, seqid):";
    }
    else {
      poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)os);
      poVar8 = std::operator<<(poVar8,"def write_results_success_");
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,"(self, success, result, seqid, oprot):");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      iVar7 = (*(ptVar4->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar7 == '\0') {
        t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
        poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
        poVar8 = std::operator<<(poVar8,"result.success = success");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"oprot.writeMessageBegin(\"");
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      poVar8 = std::operator<<(poVar8,"\", TMessageType.REPLY, seqid)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
      poVar8 = std::operator<<(poVar8,"result.write(oprot)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_288,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_288);
      poVar8 = std::operator<<(poVar8,"oprot.writeMessageEnd()");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_250);
      poVar8 = std::operator<<(poVar8,"oprot.trans.flush()");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2d0);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)os);
      poVar8 = std::operator<<(poVar8,"def write_results_exception_");
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      pcVar10 = "(self, error, result, seqid, oprot):";
    }
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    if (ptVar4->oneway_ == false) {
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.REPLY");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    poVar8 = std::operator<<(poVar8,"try:");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d0);
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_2a8,this);
    local_258 = (string *)psVar9;
    poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
    poVar8 = std::operator<<(poVar8,"error.raiseException()");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2d0);
    if (ptVar4->oneway_ == false) {
      for (pptVar11 = (local_260->members_).
                      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pptVar11 !=
          (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
        ptVar3 = *pptVar11;
        t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
        poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
        poVar8 = std::operator<<(poVar8,"except ");
        type_name_abi_cxx11_(&local_2a8,local_2b0,(*pptVar11)->type_);
        poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
        poVar8 = std::operator<<(poVar8," as ");
        psVar9 = &ptVar3->name_;
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        poVar8 = std::operator<<(poVar8,":");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2d0);
        piVar1 = &(local_2b0->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
        poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
        poVar8 = std::operator<<(poVar8,"result.");
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2d0);
        piVar1 = &(local_2b0->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
      }
    }
    this = local_2b0;
    t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    poVar8 = std::operator<<(poVar8,"except TTransport.TTransportException:");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
    poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
    psVar5 = local_258;
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
    poVar8 = std::operator<<(poVar8,(string *)&local_288);
    poVar8 = std::operator<<(poVar8,"raise");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2d0);
    if (local_268->oneway_ == false) {
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"except TApplicationException as ex:");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
      poVar8 = std::operator<<(poVar8,(string *)&local_288);
      poVar8 = std::operator<<(poVar8,"logging.exception(\'TApplication exception in handler\')");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_250);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_110,this);
      poVar8 = std::operator<<(poVar8,local_110);
      poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.EXCEPTION");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_130,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_130);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_150,this);
      poVar8 = std::operator<<(poVar8,local_150);
      poVar8 = std::operator<<(poVar8,"result = ex");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_170,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_170);
      poVar8 = std::operator<<(poVar8,"except Exception:");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_190);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1b0,this);
      poVar8 = std::operator<<(poVar8,local_1b0);
      poVar8 = std::operator<<(poVar8,"logging.exception(\'Unexpected exception in handler\')");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_1d0);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1f0,this);
      poVar8 = std::operator<<(poVar8,local_1f0);
      poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.EXCEPTION");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_210,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_210);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_230,this);
      poVar8 = std::operator<<(poVar8,local_230);
      poVar8 = std::operator<<(poVar8,
                               "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                              );
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_70);
      poVar8 = std::operator<<(poVar8,"oprot.writeMessageBegin(\"");
      poVar8 = std::operator<<(poVar8,psVar5);
      poVar8 = std::operator<<(poVar8,"\", msg_type, seqid)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_90);
      poVar8 = std::operator<<(poVar8,"result.write(oprot)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_b0);
      poVar8 = std::operator<<(poVar8,"oprot.writeMessageEnd()");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_d0,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_d0);
      poVar8 = std::operator<<(poVar8,"oprot.trans.flush()");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
LAB_0028d8fb:
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string(local_110);
LAB_0028d9b1:
      std::__cxx11::string::~string((string *)&local_250);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"except Exception:");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
      poVar8 = std::operator<<(poVar8,(string *)&local_288);
      poVar8 = std::operator<<(poVar8,"logging.exception(\'Exception in oneway handler\')");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    if (this->gen_tornado_ == true) {
      ptVar2 = ptVar4->arglist_;
      if (ptVar4->oneway_ == false) {
        poVar8 = t_generator::indent(&this->super_t_generator,(ostream *)os);
        poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.REPLY");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      }
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"try:");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2d0);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      std::operator<<((ostream *)os,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      if (ptVar4->oneway_ == false) {
        iVar7 = (*(ptVar4->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar7 == '\0') {
          std::operator<<((ostream *)os,"result.success = ");
        }
      }
      poVar8 = std::operator<<((ostream *)os,"yield gen.maybe_future(self._handler.");
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      std::operator<<(poVar8,"(");
      bVar6 = true;
      for (pptVar11 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar11 !=
          (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
        if (!bVar6) {
          std::operator<<((ostream *)os,", ");
        }
        poVar8 = std::operator<<((ostream *)os,"args.");
        std::operator<<(poVar8,(string *)&(*pptVar11)->name_);
        bVar6 = false;
      }
      local_258 = (string *)psVar9;
      poVar8 = std::operator<<((ostream *)os,"))");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      if (local_268->oneway_ == false) {
        for (pptVar11 = (local_260->members_).
                        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
            pptVar11 !=
            (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
          ptVar3 = *pptVar11;
          t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
          poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
          poVar8 = std::operator<<(poVar8,"except ");
          type_name_abi_cxx11_(&local_2a8,local_2b0,(*pptVar11)->type_);
          poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
          poVar8 = std::operator<<(poVar8," as ");
          psVar9 = &ptVar3->name_;
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          t_generator::indent_abi_cxx11_(&local_288,&local_2b0->super_t_generator);
          poVar8 = std::operator<<(poVar8,(string *)&local_288);
          (*(local_2b0->super_t_generator)._vptr_t_generator[0x1e])(&local_250);
          poVar8 = std::operator<<(poVar8,(string *)&local_250);
          poVar8 = std::operator<<(poVar8,"result.");
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          poVar8 = std::operator<<(poVar8," = ");
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2d0);
        }
      }
      this = local_2b0;
      t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"except TTransport.TTransportException:");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
      psVar5 = local_258;
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
      poVar8 = std::operator<<(poVar8,(string *)&local_288);
      poVar8 = std::operator<<(poVar8,"raise");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2d0);
      if (local_268->oneway_ == false) {
        t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
        poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
        poVar8 = std::operator<<(poVar8,"except TApplicationException as ex:");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
        poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
        poVar8 = std::operator<<(poVar8,(string *)&local_288);
        poVar8 = std::operator<<(poVar8,"logging.exception(\'TApplication exception in handler\')");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
        poVar8 = std::operator<<(poVar8,(string *)&local_250);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_110,this);
        poVar8 = std::operator<<(poVar8,local_110);
        poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.EXCEPTION");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_130,&this->super_t_generator);
        poVar8 = std::operator<<(poVar8,(string *)&local_130);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_150,this);
        poVar8 = std::operator<<(poVar8,local_150);
        poVar8 = std::operator<<(poVar8,"result = ex");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_170,&this->super_t_generator);
        poVar8 = std::operator<<(poVar8,(string *)&local_170);
        poVar8 = std::operator<<(poVar8,"except Exception:");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
        poVar8 = std::operator<<(poVar8,(string *)&local_190);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1b0,this);
        poVar8 = std::operator<<(poVar8,local_1b0);
        poVar8 = std::operator<<(poVar8,"logging.exception(\'Unexpected exception in handler\')");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
        poVar8 = std::operator<<(poVar8,(string *)&local_1d0);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1f0,this);
        poVar8 = std::operator<<(poVar8,local_1f0);
        poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.EXCEPTION");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_210,&this->super_t_generator);
        poVar8 = std::operator<<(poVar8,(string *)&local_210);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_230,this);
        poVar8 = std::operator<<(poVar8,local_230);
        poVar8 = std::operator<<(poVar8,
                                 "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                                );
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string(local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string(local_1b0);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string(local_150);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string((string *)&local_250);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
        poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
        poVar8 = std::operator<<(poVar8,"except Exception:");
        poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
        poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
        (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
        poVar8 = std::operator<<(poVar8,(string *)&local_288);
        poVar8 = std::operator<<(poVar8,"logging.exception(\'Exception in oneway handler\')");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2d0);
      if (local_268->oneway_ != false) goto LAB_0028d9dc;
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"oprot.writeMessageBegin(\"");
      poVar8 = std::operator<<(poVar8,psVar5);
      poVar8 = std::operator<<(poVar8,"\", msg_type, seqid)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
      poVar8 = std::operator<<(poVar8,"result.write(oprot)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_288,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_288);
      poVar8 = std::operator<<(poVar8,"oprot.writeMessageEnd()");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_250);
      poVar8 = std::operator<<(poVar8,"oprot.trans.flush()");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      goto LAB_0028d9b1;
    }
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    poVar8 = std::operator<<(poVar8,"try:");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2d0);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    ptVar2 = ptVar4->arglist_;
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    std::operator<<((ostream *)os,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    if (ptVar4->oneway_ == false) {
      iVar7 = (*(ptVar4->returntype_->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar7 == '\0') {
        std::operator<<((ostream *)os,"result.success = ");
      }
    }
    poVar8 = std::operator<<((ostream *)os,"self._handler.");
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    std::operator<<(poVar8,"(");
    bVar6 = true;
    for (pptVar11 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        pptVar11 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
      if (!bVar6) {
        std::operator<<((ostream *)os,", ");
      }
      poVar8 = std::operator<<((ostream *)os,"args.");
      std::operator<<(poVar8,(string *)&(*pptVar11)->name_);
      bVar6 = false;
    }
    poVar8 = std::operator<<((ostream *)os,")");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    ptVar4 = local_268;
    if (local_268->oneway_ == false) {
      t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.REPLY");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    poVar8 = std::operator<<(poVar8,"except TTransport.TTransportException:");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
    poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
    poVar8 = std::operator<<(poVar8,(string *)&local_288);
    poVar8 = std::operator<<(poVar8,"raise");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2d0);
    if (ptVar4->oneway_ == false) {
      local_258 = (string *)psVar9;
      for (pptVar11 = (local_260->members_).
                      super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                      super__Vector_impl_data._M_start; this = local_2b0,
          pptVar11 !=
          (local_260->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
        ptVar3 = *pptVar11;
        t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
        poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
        poVar8 = std::operator<<(poVar8,"except ");
        type_name_abi_cxx11_(&local_2a8,local_2b0,(*pptVar11)->type_);
        poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
        poVar8 = std::operator<<(poVar8," as ");
        psVar9 = &ptVar3->name_;
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        poVar8 = std::operator<<(poVar8,":");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2d0);
        piVar1 = &(local_2b0->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
        poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
        poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.REPLY");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2d0);
        t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
        poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
        poVar8 = std::operator<<(poVar8,"result.");
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_2d0);
        piVar1 = &(local_2b0->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
      }
      t_generator::indent_abi_cxx11_(&local_2d0,&local_2b0->super_t_generator);
      poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
      psVar5 = local_258;
      poVar8 = std::operator<<(poVar8,"except TApplicationException as ex:");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
      poVar8 = std::operator<<(poVar8,(string *)&local_288);
      poVar8 = std::operator<<(poVar8,"logging.exception(\'TApplication exception in handler\')");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_250,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_250);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_110,this);
      poVar8 = std::operator<<(poVar8,local_110);
      poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.EXCEPTION");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_130,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_130);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_150,this);
      poVar8 = std::operator<<(poVar8,local_150);
      poVar8 = std::operator<<(poVar8,"result = ex");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_170,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_170);
      poVar8 = std::operator<<(poVar8,"except Exception:");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_190);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1b0,this);
      poVar8 = std::operator<<(poVar8,local_1b0);
      poVar8 = std::operator<<(poVar8,"logging.exception(\'Unexpected exception in handler\')");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_1d0);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_1f0,this);
      poVar8 = std::operator<<(poVar8,local_1f0);
      poVar8 = std::operator<<(poVar8,"msg_type = TMessageType.EXCEPTION");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_210,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_210);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(local_230,this);
      poVar8 = std::operator<<(poVar8,local_230);
      poVar8 = std::operator<<(poVar8,
                               "result = TApplicationException(TApplicationException.INTERNAL_ERROR, \'Internal error\')"
                              );
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_70);
      poVar8 = std::operator<<(poVar8,"oprot.writeMessageBegin(\"");
      poVar8 = std::operator<<(poVar8,psVar5);
      poVar8 = std::operator<<(poVar8,"\", msg_type, seqid)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_90);
      poVar8 = std::operator<<(poVar8,"result.write(oprot)");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_b0);
      poVar8 = std::operator<<(poVar8,"oprot.writeMessageEnd()");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_d0,&this->super_t_generator);
      poVar8 = std::operator<<(poVar8,(string *)&local_d0);
      poVar8 = std::operator<<(poVar8,"oprot.trans.flush()");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      goto LAB_0028d8fb;
    }
    t_generator::indent_abi_cxx11_(&local_2d0,&this->super_t_generator);
    poVar8 = std::operator<<((ostream *)os,(string *)&local_2d0);
    poVar8 = std::operator<<(poVar8,"except Exception:");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_2a8,&this->super_t_generator);
    poVar8 = std::operator<<(poVar8,(string *)&local_2a8);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_288,this);
    poVar8 = std::operator<<(poVar8,(string *)&local_288);
    poVar8 = std::operator<<(poVar8,"logging.exception(\'Exception in oneway handler\')");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2d0);
LAB_0028d9dc:
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void t_py_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  (void)tservice;
  // Open function
  if (gen_tornado_) {
    f_service_ << indent() << "@gen.coroutine" << endl << indent() << "def process_"
               << tfunction->get_name() << "(self, seqid, iprot, oprot):" << endl;
  } else {
    f_service_ << indent() << "def process_" << tfunction->get_name()
               << "(self, seqid, iprot, oprot):" << endl;
  }

  indent_up();

  string argsname = tfunction->get_name() + "_args";
  string resultname = tfunction->get_name() + "_result";

  f_service_ << indent() << "args = " << argsname << "()" << endl << indent() << "args.read(iprot)"
             << endl << indent() << "iprot.readMessageEnd()" << endl;

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    f_service_ << indent() << "result = " << resultname << "()" << endl;
  }

  if (gen_twisted_) {
    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    f_service_ << indent() << "d = defer.maybeDeferred(self._handler." << tfunction->get_name()
               << ", ";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << ")" << endl;

    if (tfunction->is_oneway()) {
      f_service_ << indent() << "d.addErrback(self.handle_exception_" << tfunction->get_name()
                 << ", seqid)" << endl;
    } else {
      f_service_ << indent() << "d.addCallback(self.write_results_success_" << tfunction->get_name()
                 << ", result, seqid, oprot)" << endl
                 << indent() << "d.addErrback(self.write_results_exception_"
                 << tfunction->get_name() << ", result, seqid, oprot)" << endl;
    }
    f_service_ << indent() << "return d" << endl << endl;

    indent_down();

    if (tfunction->is_oneway()) {
      indent(f_service_) << "def handle_exception_" << tfunction->get_name()
                         << "(self, error, seqid):" << endl;
    } else {
      indent(f_service_) << "def write_results_success_" << tfunction->get_name()
                         << "(self, success, result, seqid, oprot):" << endl;
      indent_up();
      if (!tfunction->get_returntype()->is_void()) {
        f_service_ << indent() << "result.success = success" << endl;
      }
      f_service_ << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", TMessageType.REPLY, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl
                 << endl;
      indent_down();

      indent(f_service_) << "def write_results_exception_" << tfunction->get_name()
                         << "(self, error, result, seqid, oprot):" << endl;
    }
    indent_up();
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
    }
    f_service_ << indent() << "try:" << endl;

    // Kinda absurd
    f_service_ << indent() << indent_str() << "error.raiseException()" << endl;
    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl;
        indent_up();
        f_service_ << indent() << "result." << xname << " = " << xname << endl;
        indent_down();
      }
    }
    f_service_ << indent() << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl
                 << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Exception in oneway handler')" << endl;
    }
    indent_down();

  } else if (gen_tornado_) {
    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    if (!tfunction->is_oneway()) {
      indent(f_service_) << "msg_type = TMessageType.REPLY" << endl;
    }
    f_service_ << indent() << "try:" << endl;
    indent_up();
    f_service_ << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
      f_service_ << "result.success = ";
    }
    f_service_ << "yield gen.maybe_future(self._handler." << tfunction->get_name() << "(";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << "))" << endl;

    indent_down();
    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl
                   << indent() << indent_str() << "result." << xname << " = " << xname << endl;
      }
    }
    f_service_ << indent() << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Exception in oneway handler')" << endl;
    }

    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    }

    // Close function
    indent_down();

  } else { // py
    // Try block for a function with exceptions
    // It also catches arbitrary exceptions raised by handler method to propagate them to the client
    f_service_ << indent() << "try:" << endl;
    indent_up();

    // Generate the function call
    t_struct* arg_struct = tfunction->get_arglist();
    const std::vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    f_service_ << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
      f_service_ << "result.success = ";
    }
    f_service_ << "self._handler." << tfunction->get_name() << "(";
    bool first = true;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if (first) {
        first = false;
      } else {
        f_service_ << ", ";
      }
      f_service_ << "args." << (*f_iter)->get_name();
    }
    f_service_ << ")" << endl;
    if (!tfunction->is_oneway()) {
      f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
    }

    indent_down();
    f_service_ << indent()
               << "except TTransport.TTransportException:" << endl
               << indent() << indent_str() << "raise" << endl;

    if (!tfunction->is_oneway()) {
      for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
        const string& xname = (*x_iter)->get_name();
        f_service_ << indent() << "except " << type_name((*x_iter)->get_type()) << " as " << xname
                   << ":" << endl;
        indent_up();
        f_service_ << indent() << "msg_type = TMessageType.REPLY" << endl;
        f_service_ << indent() << "result." << xname << " = " << xname << endl;
        indent_down();
      }

      f_service_ << indent() << "except TApplicationException as ex:" << endl
                 << indent() << indent_str()
                 << "logging.exception('TApplication exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str() << "result = ex" << endl
                 << indent() << "except Exception:" << endl
                 << indent() << indent_str()
                 << "logging.exception('Unexpected exception in handler')" << endl
                 << indent() << indent_str() << "msg_type = TMessageType.EXCEPTION" << endl
                 << indent() << indent_str()
                 << "result = TApplicationException(TApplicationException.INTERNAL_ERROR, "
                    "'Internal error')"
                 << endl
                 << indent() << "oprot.writeMessageBegin(\"" << tfunction->get_name()
                 << "\", msg_type, seqid)" << endl
                 << indent() << "result.write(oprot)" << endl
                 << indent() << "oprot.writeMessageEnd()" << endl
                 << indent() << "oprot.trans.flush()" << endl;
    } else {
      f_service_ << indent() << "except Exception:" << endl
                 << indent() << indent_str() << "logging.exception('Exception in oneway handler')" << endl;
    }

    // Close function
    indent_down();
  }
}